

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O1

unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>
llvm::MemoryBuffer::getMemBuffer
          (StringRef InputData,StringRef BufferName,bool RequiresNullTerminator)

{
  undefined8 *puVar1;
  size_t __n;
  undefined7 in_register_00000081;
  char in_R9B;
  StringRef SVar2;
  SmallVectorImpl<char> local_180;
  undefined1 local_170 [256];
  Twine local_70;
  undefined1 local_58 [8];
  StringRef BufferName_local;
  
  BufferName_local.Length = InputData.Length;
  local_58 = (undefined1  [8])BufferName.Length;
  BufferName_local.Data = (char *)CONCAT71(in_register_00000081,RequiresNullTerminator);
  Twine::Twine(&local_70,(StringRef *)local_58);
  local_180.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_170;
  local_180.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_180.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x100;
  SVar2 = Twine::toStringRef(&local_70,&local_180);
  __n = SVar2.Length;
  puVar1 = (undefined8 *)operator_new(__n + 0x19);
  if (__n != 0) {
    memcpy(puVar1 + 3,SVar2.Data,__n);
  }
  *(undefined1 *)((long)(puVar1 + 3) + __n) = 0;
  if ((undefined1 *)
      local_180.super_SmallVectorTemplateBase<char,_true>.
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX != local_170) {
    free(local_180.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  *puVar1 = &PTR__MemoryBuffer_01099130;
  if ((in_R9B != '\0') && (BufferName.Data[BufferName_local.Length] != '\0')) {
    __assert_fail("(!RequiresNullTerminator || BufEnd[0] == 0) && \"Buffer is not null terminated!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/MemoryBuffer.cpp"
                  ,0x30,"void llvm::MemoryBuffer::init(const char *, const char *, bool)");
  }
  puVar1[1] = BufferName_local.Length;
  puVar1[2] = BufferName.Data + BufferName_local.Length;
  *(undefined8 **)InputData.Data = puVar1;
  return (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
         (tuple<llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>)InputData.Data;
}

Assistant:

std::unique_ptr<MemoryBuffer>
MemoryBuffer::getMemBuffer(StringRef InputData, StringRef BufferName,
                           bool RequiresNullTerminator) {
  auto *Ret = new (NamedBufferAlloc(BufferName))
      MemoryBufferMem<MemoryBuffer>(InputData, RequiresNullTerminator);
  return std::unique_ptr<MemoryBuffer>(Ret);
}